

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.h
# Opt level: O0

ostream * serialize::write<int,float>
                    (ostream *ostream_,
                    map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_>
                    *container)

{
  map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_> *this;
  bool bVar1;
  size_type sVar2;
  reference ppVar3;
  pair<const_int,_float> local_40;
  pair<const_int,_float> p;
  iterator __end0;
  iterator __begin0;
  map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_> *__range2;
  map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_> *pmStack_18;
  uint32_t size;
  map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_> *container_local;
  ostream *ostream__local;
  
  pmStack_18 = container;
  container_local =
       (map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_> *)ostream_;
  sVar2 = std::map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_>::size
                    (container);
  __range2._4_4_ = (undefined4)sVar2;
  write<unsigned_int>((ostream *)container_local,(uint *)((long)&__range2 + 4));
  this = pmStack_18;
  __end0 = std::map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_>::
           begin(pmStack_18);
  p = (pair<const_int,_float>)
      std::map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_>::end(this)
  ;
  while( true ) {
    bVar1 = std::operator!=(&__end0,(_Self *)&p);
    if (!bVar1) break;
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_float>_>::operator*(&__end0);
    local_40 = *ppVar3;
    write<int_const>((ostream *)container_local,&local_40.first);
    write<float>((ostream *)container_local,&local_40.second);
    std::_Rb_tree_iterator<std::pair<const_int,_float>_>::operator++(&__end0);
  }
  return (ostream *)container_local;
}

Assistant:

static inline ostream&  write(ostream& ostream_, map<K, V>& container)
{

	uint32_t size = container.size();
	write(ostream_, size);

	for (auto p : container)
	{
		write(ostream_, p.first);
		write(ostream_, p.second);


	}
	return ostream_;
}